

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O2

void __thiscall rengine::GlyphContext::GlyphContext(GlyphContext *this,string *fontFile)

{
  char cVar1;
  int iVar2;
  uchar *puVar3;
  ostream *poVar4;
  char local_248 [8];
  ifstream file;
  string local_40 [32];
  
  this->m_fontData = (uchar *)0x0;
  std::ifstream::ifstream(local_248,(string *)fontFile,_S_in|_S_bin|_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cerr,"E [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_40);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4,"rengine::GlyphContext::GlyphContext(const std::string &)");
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Failed to open font file \'");
    poVar4 = std::operator<<(poVar4,(string *)fontFile);
    poVar4 = std::operator<<(poVar4,"\'");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    iVar2 = std::istream::tellg();
    puVar3 = (uchar *)malloc((long)iVar2);
    this->m_fontData = puVar3;
    if (puVar3 != (uchar *)0x0) {
      std::istream::seekg((long)local_248,_S_beg);
      std::istream::read(local_248,(long)this->m_fontData);
      std::ifstream::close();
      iVar2 = stbtt_InitFont(&this->m_fontInfo,this->m_fontData,0);
      if (iVar2 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"E [");
        log_timestring_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,local_40);
        poVar4 = std::operator<<(poVar4,"]: ");
        poVar4 = std::operator<<(poVar4,"rengine::GlyphContext::GlyphContext(const std::string &)");
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,"Failed to initialize font \'");
        poVar4 = std::operator<<(poVar4,(string *)fontFile);
        poVar4 = std::operator<<(poVar4,"\'");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string(local_40);
        free(this->m_fontData);
        this->m_fontData = (uchar *)0x0;
      }
      goto LAB_001332cf;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"E [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_40);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4,"rengine::GlyphContext::GlyphContext(const std::string &)");
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Failed to allocate font data for \'");
    poVar4 = std::operator<<(poVar4,(string *)fontFile);
    poVar4 = std::operator<<(poVar4,"\'");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string(local_40);
LAB_001332cf:
  std::ifstream::~ifstream(local_248);
  return;
}

Assistant:

inline GlyphContext::GlyphContext(const std::string &fontFile)
{
    std::ifstream file(fontFile, std::ios::binary | std::ios::in | std::ios::ate);
    if (!file.is_open()) {
        loge << "Failed to open font file '" << fontFile << "'" << std::endl;
        return;
    }

    int size = file.tellg();

    m_fontData = (unsigned char *) malloc(size);
    if (!m_fontData) {
        loge << "Failed to allocate font data for '" << fontFile << "'" << std::endl;
        return;
    }

    file.seekg(0, std::ios::beg);
    file.read((char *) m_fontData, size);
    file.close();

    if (!stbtt_InitFont(&m_fontInfo, m_fontData, 0)) {
        loge << "Failed to initialize font '" << fontFile << "'" << std::endl;
        free(m_fontData);
        m_fontData = 0;
        return;
    }
}